

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::BeginGlobal
          (BinaryReaderObjdump *this,Index index,Type type,bool mutable_)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  const_pointer pcVar4;
  undefined1 local_30 [8];
  string_view name;
  bool mutable__local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  Type type_local;
  
  name.size_._3_1_ = mutable_;
  name.size_._4_4_ = index;
  this_local._0_4_ = type.enum_;
  pcVar2 = Type::GetName((Type *)&this_local);
  PrintDetails(this," - global[%u] %s mutable=%d",(ulong)index,pcVar2,(ulong)(name.size_._3_1_ & 1))
  ;
  _local_30 = BinaryReaderObjdumpBase::GetGlobalName
                        (&this->super_BinaryReaderObjdumpBase,name.size_._4_4_);
  bVar1 = string_view::empty((string_view *)local_30);
  if (!bVar1) {
    sVar3 = string_view::length((string_view *)local_30);
    pcVar4 = string_view::data((string_view *)local_30);
    PrintDetails(this," <%.*s>",sVar3 & 0xffffffff,pcVar4);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::BeginGlobal(Index index, Type type, bool mutable_) {
  PrintDetails(" - global[%" PRIindex "] %s mutable=%d", index, type.GetName(),
               mutable_);
  string_view name = GetGlobalName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  return Result::Ok;
}